

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  float fVar1;
  ImGuiDir IVar2;
  ImGuiWindow *pIVar3;
  float fVar4;
  ImGuiContext *pIVar5;
  int iVar6;
  int iVar7;
  bool *pbVar8;
  ImGuiContext *g;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ImRect unclipped_rect;
  ImRect local_48;
  float local_38;
  
  pIVar5 = GImGui;
  if (GImGui->LogEnabled == true) {
    *out_items_display_start = 0;
  }
  else {
    pIVar3 = GImGui->CurrentWindow;
    pbVar8 = &GImGui->CurrentTable->HostSkipItems;
    if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
      pbVar8 = &pIVar3->SkipItems;
    }
    if (*pbVar8 == true) {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
      return;
    }
    local_48.Min = (pIVar3->ClipRect).Min;
    local_48.Max = (pIVar3->ClipRect).Max;
    if (GImGui->NavMoveRequest == true) {
      local_38 = items_height;
      ImRect::Add(&local_48,&GImGui->NavScoringRect);
      items_height = local_38;
    }
    if ((pIVar5->NavJustMovedToId != 0) && (pIVar3->NavLastIds[0] == pIVar5->NavJustMovedToId)) {
      fVar1 = (pIVar3->Pos).y;
      fVar4 = fVar1 + pIVar3->NavRectRel[0].Min.y;
      fVar1 = fVar1 + pIVar3->NavRectRel[0].Max.y;
      if (fVar4 < local_48.Min.y) {
        local_48.Min.y = fVar4;
      }
      if (local_48.Max.y < fVar1) {
        local_48.Max.y = fVar1;
      }
    }
    auVar11 = vinsertps_avx(ZEXT416((uint)local_48.Max.y),ZEXT416((uint)local_48.Min.y),0x10);
    fVar1 = (pIVar3->DC).CursorPos.y;
    auVar12._4_4_ = fVar1;
    auVar12._0_4_ = fVar1;
    auVar12._8_4_ = fVar1;
    auVar12._12_4_ = fVar1;
    auVar11 = vsubps_avx(auVar11,auVar12);
    auVar10._4_4_ = items_height;
    auVar10._0_4_ = items_height;
    auVar10._8_4_ = items_height;
    auVar10._12_4_ = items_height;
    auVar11 = vdivps_avx(auVar11,auVar10);
    auVar9._0_8_ = CONCAT44((int)auVar11._4_4_,(int)auVar11._0_4_);
    auVar9._8_4_ = (int)auVar11._8_4_;
    auVar9._12_4_ = (int)auVar11._12_4_;
    if (pIVar5->NavMoveRequest == true) {
      IVar2 = pIVar5->NavMoveClipDir;
      auVar11._4_4_ = IVar2;
      auVar11._0_4_ = IVar2;
      auVar11._8_4_ = IVar2;
      auVar11._12_4_ = IVar2;
      auVar11 = vpcmpeqd_avx(auVar11,_DAT_001d4940);
      auVar12 = vpsrld_avx(auVar11,0x1f);
      auVar11 = vpblendd_avx2(auVar12,auVar11,2);
      auVar11 = vpaddd_avx(auVar11,auVar9);
      auVar9._0_8_ = auVar11._0_8_;
    }
    iVar6 = (int)((ulong)auVar9._0_8_ >> 0x20);
    iVar7 = items_count;
    if (iVar6 < items_count) {
      iVar7 = iVar6;
    }
    iVar6 = 0;
    if (-1 < auVar9._0_8_) {
      iVar6 = iVar7;
    }
    iVar7 = (int)auVar9._0_8_ + 1;
    if (iVar7 < items_count) {
      items_count = iVar7;
    }
    if (iVar7 < iVar6) {
      items_count = iVar6;
    }
    *out_items_display_start = iVar6;
  }
  *out_items_display_end = items_count;
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (GetSkipItemForListClipping())
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    // We create the union of the ClipRect and the NavScoringRect which at worst should be 1 page away from ClipRect
    ImRect unclipped_rect = window->ClipRect;
    if (g.NavMoveRequest)
        unclipped_rect.Add(g.NavScoringRect);
    if (g.NavJustMovedToId && window->NavLastIds[0] == g.NavJustMovedToId)
        unclipped_rect.Add(ImRect(window->Pos + window->NavRectRel[0].Min, window->Pos + window->NavRectRel[0].Max));

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((unclipped_rect.Min.y - pos.y) / items_height);
    int end = (int)((unclipped_rect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}